

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void safe_fprintf(FILE_conflict *f,char *fmt,...)

{
  char cVar1;
  bool bVar2;
  char in_AL;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar7;
  uint uVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  FILE *__stream;
  char *__s;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  wchar_t wc;
  va_list ap;
  char outbuff [256];
  char fmtbuff_stack [256];
  wchar_t local_31c;
  FILE *local_318;
  char *local_310;
  undefined8 local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char local_2e8 [256];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  char local_138 [264];
  
  local_2f8 = local_1e8;
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Qa;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  local_308 = 0x3000000010;
  local_300 = &stack0x00000008;
  __s = local_138;
  local_318 = (FILE *)f;
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1c8 = in_R8;
  local_1c0 = in_R9;
  uVar3 = vsnprintf(__s,0x100,fmt,&local_308);
  if (uVar3 < 0x100) {
LAB_001118b8:
    local_310 = (char *)0x0;
  }
  else {
    bVar2 = 0xff < (int)uVar3;
    uVar8 = 0x100;
    local_310 = (char *)0x0;
    __s = local_138;
    do {
      if (bVar2) {
        uVar8 = uVar3 + 1;
      }
      else if ((int)uVar8 < 0x2000) {
        uVar8 = uVar8 * 2;
      }
      else {
        if (999999 < (int)uVar8) {
          local_310[uVar8 - 1] = '\0';
          uVar3 = uVar8;
          break;
        }
        uVar8 = uVar8 + (uVar8 >> 2);
      }
      free(local_310);
      local_310 = (char *)malloc((ulong)uVar8);
      if (local_310 == (char *)0x0) {
        uVar3 = 0xff;
        goto LAB_001118b8;
      }
      local_2f8 = local_1e8;
      local_300 = &stack0x00000008;
      local_308 = 0x3000000010;
      uVar3 = vsnprintf(local_310,(ulong)uVar8,fmt,&local_308);
      bVar2 = (int)uVar8 <= (int)uVar3;
      __s = local_310;
    } while ((int)uVar3 < 0 || bVar2);
  }
  iVar4 = mbtowc((wchar_t *)0x0,(char *)0x0,1);
  if (iVar4 != -1) {
    uVar7 = 0;
    __stream = local_318;
    if (*__s != '\0') {
      bVar2 = true;
      do {
        if ((bVar2) && (iVar4 = mbtowc(&local_31c,__s,(long)(int)uVar3), iVar4 != -1)) {
          uVar3 = uVar3 - iVar4;
          iVar5 = iswprint(local_31c);
          if ((iVar5 == 0) || (local_31c == L'\\')) {
            if (0 < iVar4) {
              iVar4 = iVar4 + 1;
              do {
                cVar1 = *__s;
                __s = __s + 1;
                sVar6 = bsdtar_expand_char(local_2e8,uVar7 & 0xffffffff,cVar1);
                uVar7 = (ulong)(uint)((int)sVar6 + (int)uVar7);
                iVar4 = iVar4 + -1;
                __stream = local_318;
              } while (1 < iVar4);
            }
          }
          else if (0 < iVar4) {
            uVar7 = uVar7 & 0xffffffff;
            iVar4 = iVar4 + 1;
            do {
              cVar1 = *__s;
              __s = __s + 1;
              local_2e8[uVar7] = cVar1;
              uVar7 = uVar7 + 1;
              iVar4 = iVar4 + -1;
            } while (1 < iVar4);
          }
        }
        else {
          cVar1 = *__s;
          __s = __s + 1;
          sVar6 = bsdtar_expand_char(local_2e8,uVar7 & 0xffffffff,cVar1);
          bVar2 = false;
          uVar7 = (ulong)(uint)((int)sVar6 + (int)uVar7);
        }
        if (0xec < (uint)uVar7) {
          local_2e8[uVar7 & 0xffffffff] = '\0';
          fputs(local_2e8,__stream);
          uVar7 = 0;
        }
      } while (*__s != '\0');
      uVar7 = uVar7 & 0xffffffff;
    }
    local_2e8[uVar7] = '\0';
    fputs(local_2e8,__stream);
  }
  free(local_310);
  return;
}

Assistant:

void
safe_fprintf(FILE *f, const char *fmt, ...)
{
	char fmtbuff_stack[256]; /* Place to format the printf() string. */
	char outbuff[256]; /* Buffer for outgoing characters. */
	char *fmtbuff_heap; /* If fmtbuff_stack is too small, we use malloc */
	char *fmtbuff;  /* Pointer to fmtbuff_stack or fmtbuff_heap. */
	int fmtbuff_length;
	int length, n;
	va_list ap;
	const char *p;
	unsigned i;
	wchar_t wc;
	char try_wc;

	/* Use a stack-allocated buffer if we can, for speed and safety. */
	fmtbuff_heap = NULL;
	fmtbuff_length = sizeof(fmtbuff_stack);
	fmtbuff = fmtbuff_stack;

	/* Try formatting into the stack buffer. */
	va_start(ap, fmt);
	length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
	va_end(ap);

	/* If the result was too large, allocate a buffer on the heap. */
	while (length < 0 || length >= fmtbuff_length) {
		if (length >= fmtbuff_length)
			fmtbuff_length = length+1;
		else if (fmtbuff_length < 8192)
			fmtbuff_length *= 2;
		else if (fmtbuff_length < 1000000)
			fmtbuff_length += fmtbuff_length / 4;
		else {
			length = fmtbuff_length;
			fmtbuff_heap[length-1] = '\0';
			break;
		}
		free(fmtbuff_heap);
		fmtbuff_heap = malloc(fmtbuff_length);

		/* Reformat the result into the heap buffer if we can. */
		if (fmtbuff_heap != NULL) {
			fmtbuff = fmtbuff_heap;
			va_start(ap, fmt);
			length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
			va_end(ap);
		} else {
			/* Leave fmtbuff pointing to the truncated
			 * string in fmtbuff_stack. */
			length = sizeof(fmtbuff_stack) - 1;
			break;
		}
	}

	/* Note: mbrtowc() has a cleaner API, but mbtowc() seems a bit
	 * more portable, so we use that here instead. */
	if (mbtowc(NULL, NULL, 1) == -1) { /* Reset the shift state. */
		/* mbtowc() should never fail in practice, but
		 * handle the theoretical error anyway. */
		free(fmtbuff_heap);
		return;
	}

	/* Write data, expanding unprintable characters. */
	p = fmtbuff;
	i = 0;
	try_wc = 1;
	while (*p != '\0') {

		/* Convert to wide char, test if the wide
		 * char is printable in the current locale. */
		if (try_wc && (n = mbtowc(&wc, p, length)) != -1) {
			length -= n;
			if (iswprint(wc) && wc != L'\\') {
				/* Printable, copy the bytes through. */
				while (n-- > 0)
					outbuff[i++] = *p++;
			} else {
				/* Not printable, format the bytes. */
				while (n-- > 0)
					i += (unsigned)bsdtar_expand_char(
					    outbuff, i, *p++);
			}
		} else {
			/* After any conversion failure, don't bother
			 * trying to convert the rest. */
			i += (unsigned)bsdtar_expand_char(outbuff, i, *p++);
			try_wc = 0;
		}

		/* If our output buffer is full, dump it and keep going. */
		if (i > (sizeof(outbuff) - 20)) {
			outbuff[i] = '\0';
			fprintf(f, "%s", outbuff);
			i = 0;
		}
	}
	outbuff[i] = '\0';
	fprintf(f, "%s", outbuff);

	/* If we allocated a heap-based formatting buffer, free it now. */
	free(fmtbuff_heap);
}